

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O0

void Dau_FunctionEnum(int nInputs,int nVars,int nNodeMax,int fUseTwo,int fReduce,int fVerbose)

{
  Vec_Int_t *vTtMem_00;
  int nInputs_00;
  int iVar1;
  uint uVar2;
  uint iVar;
  int nFronts;
  Vec_Int_t *p;
  word wVar3;
  word wVar4;
  word *pwVar5;
  word wVar6;
  word wVar7;
  abctime aVar8;
  bool local_1d1;
  ulong local_1d0;
  word tCur_1;
  word tGates [5];
  word Cof11;
  word Cof10;
  word Cof01;
  word Cof00;
  word Cof1_1;
  word Cof0_1;
  int g2;
  int g1;
  int nSupp_1;
  int NodSup_1;
  word *pTruth_1;
  word Cof1;
  word Cof0;
  word tCur;
  word tGate;
  uint local_130;
  int SymVars;
  int nSupp;
  int NodSup;
  word *pTruth;
  int fExpand;
  int Count2;
  word Truth [4];
  int Limit [32];
  int local_70;
  int nNew;
  int Entry;
  int n;
  int m;
  int k;
  int u;
  int v;
  Vec_Int_t *vNodSup;
  Vec_Mem_t *vTtMem;
  Abc_TtHieMan_t *pMan;
  word nSteps;
  abctime aStack_30;
  int nWords;
  abctime clk;
  int fVerbose_local;
  int fReduce_local;
  int fUseTwo_local;
  int nNodeMax_local;
  int nVars_local;
  int nInputs_local;
  
  clk._0_4_ = fVerbose;
  clk._4_4_ = fReduce;
  fVerbose_local = fUseTwo;
  fReduce_local = nNodeMax;
  fUseTwo_local = nVars;
  nNodeMax_local = nInputs;
  aStack_30 = Abc_Clock();
  nSteps._4_4_ = Abc_TtWordNum(nNodeMax_local);
  pMan = (Abc_TtHieMan_t *)0x0;
  vTtMem = (Vec_Mem_t *)Abc_TtHieManStart(nNodeMax_local,5);
  vNodSup = (Vec_Int_t *)Vec_MemAlloc(nSteps._4_4_,0x10);
  p = Vec_IntAlloc(0x10000);
  memset(Truth + 3,0,0x80);
  Truth[3]._0_4_ = 1;
  Truth[3]._4_4_ = 2;
  memset(&fExpand,0,0x20);
  if (((fUseTwo_local < 3) || (nNodeMax_local < fUseTwo_local)) || (6 < nNodeMax_local)) {
    __assert_fail("nVars >= 3 && nVars <= nInputs && nInputs <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                  ,0x277,"void Dau_FunctionEnum(int, int, int, int, int, int)");
  }
  Vec_MemHashAlloc((Vec_Mem_t *)vNodSup,0x10000);
  Vec_MemHashInsert((Vec_Mem_t *)vNodSup,(word *)&fExpand);
  Vec_IntPush(p,0);
  Abc_TtIthVar((word *)&fExpand,0,nNodeMax_local);
  Abc_TtNot((word *)&fExpand,nSteps._4_4_);
  Vec_MemHashInsert((Vec_Mem_t *)vNodSup,(word *)&fExpand);
  Vec_IntPush(p,1);
  Dau_PrintStats(0,nNodeMax_local,fUseTwo_local,p,0,2,(word)pMan,0,aStack_30);
  for (nNew = 1; nNew <= fReduce_local; nNew = nNew + 1) {
    pTruth._4_4_ = 0;
    local_1d1 = clk._4_4_ != 0 && nNew == fReduce_local;
    pTruth._0_4_ = (uint)((local_1d1 ^ 0xffU) & 1);
    for (local_70 = Limit[(long)(nNew + -1) + -2]; local_70 < Limit[(long)nNew + -2];
        local_70 = local_70 + 1) {
      _nSupp = Vec_MemReadEntry((Vec_Mem_t *)vNodSup,local_70);
      SymVars = Vec_IntEntry(p,local_70);
      local_130 = SymVars & 0xf;
      tGate._4_4_ = Dau_CountSymms2(*_nSupp,local_130);
      if (nNew + -1 != SymVars >> 0x10) {
        __assert_fail("n-1 == (NodSup >> 16)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                      ,0x28d,"void Dau_FunctionEnum(int, int, int, int, int, int)");
      }
      iVar1 = Abc_Tt6HasVar(*_nSupp,local_130);
      if (iVar1 != 0) {
        __assert_fail("!Abc_Tt6HasVar(*pTruth, nSupp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                      ,0x28e,"void Dau_FunctionEnum(int, int, int, int, int, int)");
      }
      for (k = 0; k < (int)local_130; k = k + 1) {
        if ((tGate._4_4_ & 1 << ((byte)k & 0x1f)) == 0) {
          wVar3 = Abc_Tt6Cofactor0(*_nSupp,k);
          wVar4 = Abc_Tt6Cofactor1(*_nSupp,k);
          if (((int)local_130 < nNodeMax_local) && ((uint)pTruth != 0)) {
            tCur = s_Truths6[k] & s_Truths6[(int)local_130];
            Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
            Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,fUseTwo_local,
                               local_130 + 1,(Vec_Mem_t *)vNodSup,p,local_70,aStack_30);
            Cof0 = tCur & wVar3 | (tCur ^ 0xffffffffffffffff) & wVar4;
            Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,fUseTwo_local,
                               local_130 + 1,(Vec_Mem_t *)vNodSup,p,local_70,aStack_30);
            tCur = s_Truths6[k] ^ s_Truths6[(int)local_130];
            Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
            Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,fUseTwo_local,
                               local_130 + 1,(Vec_Mem_t *)vNodSup,p,local_70,aStack_30);
            pMan = (Abc_TtHieMan_t *)((long)&pMan->nLastLevel + 3);
          }
          if ((uint)pTruth != 0) {
            for (n = 0; n < (int)local_130; n = n + 1) {
              if ((n != k) && (((tGate._4_4_ & 1 << ((byte)n & 0x1f)) == 0 || (n == k + 1)))) {
                tCur = s_Truths6[k] & s_Truths6[n];
                Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
                Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,fUseTwo_local,
                                   local_130,(Vec_Mem_t *)vNodSup,p,local_70,aStack_30);
                Cof0 = tCur & wVar3 | (tCur ^ 0xffffffffffffffff) & wVar4;
                Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,fUseTwo_local,
                                   local_130,(Vec_Mem_t *)vNodSup,p,local_70,aStack_30);
                tCur = s_Truths6[k] & (s_Truths6[n] ^ 0xffffffffffffffff);
                Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
                Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,fUseTwo_local,
                                   local_130,(Vec_Mem_t *)vNodSup,p,local_70,aStack_30);
                Cof0 = tCur & wVar3 | (tCur ^ 0xffffffffffffffff) & wVar4;
                Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,fUseTwo_local,
                                   local_130,(Vec_Mem_t *)vNodSup,p,local_70,aStack_30);
                tCur = s_Truths6[k] ^ s_Truths6[n];
                Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
                Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,fUseTwo_local,
                                   local_130,(Vec_Mem_t *)vNodSup,p,local_70,aStack_30);
                pMan = (Abc_TtHieMan_t *)((long)&pMan->nWords + 1);
              }
            }
          }
          for (n = 0; n < (int)local_130; n = n + 1) {
            Entry = n;
            if (n != k) {
              while (Entry = Entry + 1, Entry < (int)local_130) {
                if (Entry != k) {
                  tCur = s_Truths6[Entry] & s_Truths6[n];
                  Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  Cof0 = tCur & wVar3 | (tCur ^ 0xffffffffffffffff) & wVar4;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  tCur = s_Truths6[Entry] & (s_Truths6[n] ^ 0xffffffffffffffff);
                  Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  Cof0 = tCur & wVar3 | (tCur ^ 0xffffffffffffffff) & wVar4;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  tCur = (s_Truths6[Entry] ^ 0xffffffffffffffff) & s_Truths6[n];
                  Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  Cof0 = tCur & wVar3 | (tCur ^ 0xffffffffffffffff) & wVar4;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  tCur = (s_Truths6[Entry] ^ 0xffffffffffffffff) &
                         (s_Truths6[n] ^ 0xffffffffffffffff);
                  Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  Cof0 = tCur & wVar3 | (tCur ^ 0xffffffffffffffff) & wVar4;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  tCur = s_Truths6[Entry] ^ s_Truths6[n];
                  Cof0 = tCur & wVar4 | (tCur ^ 0xffffffffffffffff) & wVar3;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  tCur = s_Truths6[Entry] ^ s_Truths6[n];
                  Cof0 = tCur & wVar3 | (tCur ^ 0xffffffffffffffff) & wVar4;
                  Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&Cof0,nNew,nNodeMax_local,
                                     fUseTwo_local,local_130,(Vec_Mem_t *)vNodSup,p,local_70,
                                     aStack_30);
                  pMan = (Abc_TtHieMan_t *)((long)pMan->vTtMem + 2);
                }
              }
            }
          }
        }
      }
    }
    if (((fVerbose_local != 0) && (2 < nNew)) && ((uint)pTruth != 0)) {
      for (local_70 = Limit[(long)(nNew + -2) + -2]; local_70 < Limit[(long)(nNew + -1) + -2];
          local_70 = local_70 + 1) {
        pwVar5 = Vec_MemReadEntry((Vec_Mem_t *)vNodSup,local_70);
        uVar2 = Vec_IntEntry(p,local_70);
        iVar = uVar2 & 0xf;
        if (nNew + -2 != (int)uVar2 >> 0x10) {
          __assert_fail("n-2 == (NodSup >> 16)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x2f4,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        iVar1 = Abc_Tt6HasVar(*pwVar5,iVar);
        if (iVar1 != 0) {
          __assert_fail("!Abc_Tt6HasVar(*pTruth, nSupp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn.c"
                        ,0x2f5,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        for (k = 0; k < (int)iVar; k = k + 1) {
          for (m = 0; m < (int)iVar; m = m + 1) {
            if (m != k) {
              wVar3 = Abc_Tt6Cofactor0(*pwVar5,k);
              wVar4 = Abc_Tt6Cofactor1(*pwVar5,k);
              wVar6 = Abc_Tt6Cofactor0(wVar3,m);
              wVar3 = Abc_Tt6Cofactor1(wVar3,m);
              wVar7 = Abc_Tt6Cofactor0(wVar4,m);
              tGates[4] = Abc_Tt6Cofactor1(wVar4,m);
              tCur_1 = s_Truths6[k] & s_Truths6[m];
              tGates[0] = s_Truths6[k] & (s_Truths6[m] ^ 0xffffffffffffffff);
              tGates[1] = (s_Truths6[k] ^ 0xffffffffffffffff) & s_Truths6[m];
              tGates[2] = s_Truths6[k] | s_Truths6[m];
              tGates[3] = s_Truths6[k] ^ s_Truths6[m];
              for (Cof0_1._4_4_ = 0; Cof0_1._0_4_ = Cof0_1._4_4_, Cof0_1._4_4_ < 5;
                  Cof0_1._4_4_ = Cof0_1._4_4_ + 1) {
                while (Cof0_1._0_4_ = (int)Cof0_1 + 1, (int)Cof0_1 < 5) {
                  local_1d0 = tGates[(long)(int)Cof0_1 + -1] &
                              (tGates[(long)Cof0_1._4_4_ + -1] & tGates[4] |
                              (tGates[(long)Cof0_1._4_4_ + -1] ^ 0xffffffffffffffff) & wVar7) |
                              (tGates[(long)(int)Cof0_1 + -1] ^ 0xffffffffffffffff) &
                              (tGates[(long)Cof0_1._4_4_ + -1] & wVar3 |
                              (tGates[(long)Cof0_1._4_4_ + -1] ^ 0xffffffffffffffff) & wVar6);
                  iVar1 = Dau_InsertFunction((Abc_TtHieMan_t *)vTtMem,&local_1d0,nNew,nNodeMax_local
                                             ,fUseTwo_local,iVar,(Vec_Mem_t *)vNodSup,p,local_70,
                                             aStack_30);
                  pTruth._4_4_ = iVar1 + pTruth._4_4_;
                }
              }
            }
          }
        }
      }
    }
    iVar1 = Vec_IntSize(p);
    Limit[(long)(nNew + 1) + -2] = iVar1;
    iVar1 = Dau_PrintStats(nNew,nNodeMax_local,fUseTwo_local,p,Limit[(long)nNew + -2],
                           Limit[(long)(nNew + 1) + -2],(word)pMan,pTruth._4_4_,aStack_30);
    if (iVar1 == 0) break;
  }
  nInputs_00 = nNodeMax_local;
  iVar1 = fUseTwo_local;
  vTtMem_00 = vNodSup;
  nFronts = Vec_IntSize(p);
  Dau_TablesSave(nInputs_00,iVar1,(Vec_Mem_t *)vTtMem_00,p,nFronts,aStack_30);
  aVar8 = Abc_Clock();
  Abc_PrintTime(1,"Total time",aVar8 - aStack_30);
  Abc_TtHieManStop((Abc_TtHieMan_t *)vTtMem);
  Vec_MemHashFree((Vec_Mem_t *)vNodSup);
  Vec_MemFreeP((Vec_Mem_t **)&vNodSup);
  Vec_IntFree(p);
  fflush(_stdout);
  return;
}

Assistant:

void Dau_FunctionEnum( int nInputs, int nVars, int nNodeMax, int fUseTwo, int fReduce, int fVerbose )
{
    abctime clk = Abc_Clock();
    int nWords = Abc_TtWordNum(nInputs); word nSteps = 0;
    Abc_TtHieMan_t * pMan = Abc_TtHieManStart( nInputs, 5 );
    Vec_Mem_t * vTtMem  = Vec_MemAlloc( nWords, 16 );
    Vec_Int_t * vNodSup = Vec_IntAlloc( 1 << 16 );
    int v, u, k, m, n, Entry, nNew, Limit[32] = {1, 2};
    word Truth[4] = {0};
    assert( nVars >= 3 && nVars <= nInputs && nInputs <= 6 );
    Vec_MemHashAlloc( vTtMem,  1<<16 );
    // add constant 0
    Vec_MemHashInsert( vTtMem,  Truth );
    Vec_IntPush( vNodSup, 0 ); // nodes=0, supp=0
    // add buffer/inverter
    Abc_TtIthVar( Truth, 0, nInputs );
    Abc_TtNot( Truth, nWords );
    Vec_MemHashInsert( vTtMem,  Truth );
    Vec_IntPush( vNodSup, 1 ); // nodes=0, supp=1
    Dau_PrintStats( 0, nInputs, nVars, vNodSup, 0, 2, nSteps, 0, clk );
    // numerate other functions based on how many nodes they have
    for ( n = 1; n <= nNodeMax; n++ )
    {
        int Count2 = 0;
        int fExpand = !(fReduce && n == nNodeMax);
        for ( Entry = Limit[n-1]; Entry < Limit[n]; Entry++ )
        {
            word * pTruth = Vec_MemReadEntry( vTtMem, Entry );
            int NodSup = Vec_IntEntry(vNodSup, Entry);
            int nSupp = 0xF & NodSup;
            int SymVars = Dau_CountSymms2( pTruth[0], nSupp );
            assert( n-1 == (NodSup >> 16) );
            assert( !Abc_Tt6HasVar(*pTruth, nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ ) if ( (SymVars & (1 << v)) == 0 )
            {
                word tGate, tCur;
                word Cof0 = Abc_Tt6Cofactor0( *pTruth, v );
                word Cof1 = Abc_Tt6Cofactor1( *pTruth, v );
                // add one extra variable to support
                if ( nSupp < nInputs && fExpand )
                {
                    tGate = s_Truths6[v] & s_Truths6[nSupp];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );


                    tGate = s_Truths6[v] ^ s_Truths6[nSupp];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );

                    nSteps += 3;
                }
                // add one cross bar
                if ( fExpand )
                for ( k = 0; k < nSupp; k++ ) if ( k != v && ((SymVars & (1 << k)) == 0 || k == v+1) )
                {
                    tGate = s_Truths6[v] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[v] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );


                    tGate = s_Truths6[v] ^ s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    nSteps += 5;
                }
                // add two cross bars
                for ( k = 0;   k < nSupp; k++ ) if ( k != v )//&& ((SymVars & (1 << k)) == 0) )
                for ( m = k+1; m < nSupp; m++ ) if ( m != v )//&& ((SymVars & (1 << m)) == 0 || m == k+1) )
                {
                    tGate = s_Truths6[m] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[m] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = ~s_Truths6[m] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = ~s_Truths6[m] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    
                    tGate = s_Truths6[m] ^ s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[m] ^ s_Truths6[k];
                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    nSteps += 10;
                }
            }
        } 
        if ( fUseTwo && n > 2 && fExpand )
        for ( Entry = Limit[n-2]; Entry < Limit[n-1]; Entry++ )
        {
            word * pTruth = Vec_MemReadEntry( vTtMem, Entry );
            int NodSup = Vec_IntEntry(vNodSup, Entry);
            int nSupp = 0xF & NodSup; int g1, g2;
            assert( n-2 == (NodSup >> 16) );
            assert( !Abc_Tt6HasVar(*pTruth, nSupp) );
            for ( v = 0; v < nSupp; v++ )
            for ( u = 0; u < nSupp; u++ ) if ( u != v )
            {
                word Cof0 = Abc_Tt6Cofactor0( *pTruth, v );
                word Cof1 = Abc_Tt6Cofactor1( *pTruth, v );

                word Cof00 = Abc_Tt6Cofactor0( Cof0, u );
                word Cof01 = Abc_Tt6Cofactor1( Cof0, u );
                word Cof10 = Abc_Tt6Cofactor0( Cof1, u );
                word Cof11 = Abc_Tt6Cofactor1( Cof1, u );

                word tGates[5], tCur;
                tGates[0] =  s_Truths6[v] &  s_Truths6[u];
                tGates[1] =  s_Truths6[v] & ~s_Truths6[u];
                tGates[2] = ~s_Truths6[v] &  s_Truths6[u];
                tGates[3] =  s_Truths6[v] |  s_Truths6[u];
                tGates[4] =  s_Truths6[v] ^  s_Truths6[u];

                for ( g1 = 0;    g1 < 5; g1++ )
                for ( g2 = g1+1; g2 < 5; g2++ )
                {
                    Cof0  = (tGates[g1] & Cof01) | (~tGates[g1] & Cof00);
                    Cof1  = (tGates[g1] & Cof11) | (~tGates[g1] & Cof10);

                    tCur  = (tGates[g2] & Cof1)  | (~tGates[g2] & Cof0);
                    Count2 += Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );
                }
            }
        }
        Limit[n+1] = Vec_IntSize(vNodSup);
        nNew = Dau_PrintStats( n, nInputs, nVars, vNodSup, Limit[n], Limit[n+1], nSteps, Count2, clk );
        if ( nNew == 0 )
            break;
    }
    Dau_TablesSave( nInputs, nVars, vTtMem, vNodSup, Vec_IntSize(vNodSup), clk );
    Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    //Dau_DumpFuncs( vTtMem, vNodSup, nVars, nNodeMax );
    //Dau_ExactNpnPrint( vTtMem, vNodSup, nVars, nInputs, n );
    Abc_TtHieManStop( pMan );
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    Vec_IntFree( vNodSup );
    fflush(stdout);
}